

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_tcp_socket.c
# Opt level: O0

ssize_t amqp_tcp_socket_writev(void *base,iovec *iov,int iovcnt)

{
  ssize_t sVar1;
  int in_EDX;
  size_t in_RSI;
  void *in_RDI;
  void *unaff_retaddr;
  int i;
  ssize_t ret;
  amqp_tcp_socket_t *self;
  int local_2c;
  
  local_2c = 0;
  while( true ) {
    if (in_EDX + -1 <= local_2c) {
      sVar1 = amqp_tcp_socket_send_inner(unaff_retaddr,in_RDI,in_RSI,in_EDX);
      return sVar1;
    }
    sVar1 = amqp_tcp_socket_send_inner(unaff_retaddr,in_RDI,in_RSI,in_EDX);
    if (sVar1 != 0) break;
    local_2c = local_2c + 1;
  }
  return sVar1;
}

Assistant:

static ssize_t
amqp_tcp_socket_writev(void *base, struct iovec *iov, int iovcnt)
{
  struct amqp_tcp_socket_t *self = (struct amqp_tcp_socket_t *)base;
  ssize_t ret;

#if defined(_WIN32)
  DWORD res;
  /* Making the assumption here that WSAsend won't do a partial send
   * unless an error occured, in which case we're hosed so it doesn't matter */
  if (WSASend(self->sockfd, (LPWSABUF)iov, iovcnt, &res, 0, NULL, NULL) == 0) {
    self->internal_error = 0;
    ret = AMQP_STATUS_OK;
  } else {
    self->internal_error = WSAGetLastError();
    ret = AMQP_STATUS_SOCKET_ERROR;
  }
  return ret;

#elif defined(MSG_MORE)
  int i;
  for (i = 0; i < iovcnt - 1; ++i) {
    ret = amqp_tcp_socket_send_inner(self, iov[i].iov_base, iov[i].iov_len, MSG_MORE);
    if (ret != AMQP_STATUS_OK) {
      goto exit;
    }
  }
  ret = amqp_tcp_socket_send_inner(self, iov[i].iov_base, iov[i].iov_len, 0);

exit:
  return ret;

#elif defined(SO_NOSIGPIPE) || !defined(MSG_NOSIGNAL)
  int i;
  ssize_t len_left = 0;


  struct iovec *iov_left = iov;
  int iovcnt_left = iovcnt;

  for (i = 0; i < iovcnt; ++i) {
    len_left += iov[i].iov_len;
  }

start:
  ret = writev(self->sockfd, iov_left, iovcnt_left);

  if (ret < 0) {
    self->internal_error = amqp_os_socket_error();
    if (EINTR == self->internal_error) {
      goto start;
    } else {
      self->internal_error = amqp_os_socket_error();
      ret = AMQP_STATUS_SOCKET_ERROR;
    }
  } else {
    if (ret == len_left) {
      self->internal_error = 0;
      ret = AMQP_STATUS_OK;
    } else {
      len_left -= ret;
      for (i = 0; i < iovcnt_left; ++i) {
        if (ret < (ssize_t)iov_left[i].iov_len) {
          iov_left[i].iov_base = ((char*)iov_left[i].iov_base) + ret;
          iov_left[i].iov_len -= ret;

          iovcnt_left -= i;
          iov_left += i;
          break;
        } else {
          ret -= iov_left[i].iov_len;
        }
      }
      goto start;
    }
  }

  return ret;

#else
  int i;
  size_t bytes = 0;
  void *bufferp;

  for (i = 0; i < iovcnt; ++i) {
    bytes += iov[i].iov_len;
  }

  if (self->buffer_length < bytes) {
    self->buffer = realloc(self->buffer, bytes);
    if (NULL == self->buffer) {
      self->buffer_length = 0;
      self->internal_error = 0;
      ret = AMQP_STATUS_NO_MEMORY;
      goto exit;
    }
    self->buffer_length = bytes;
  }

  bufferp = self->buffer;
  for (i = 0; i < iovcnt; ++i) {
    memcpy(bufferp, iov[i].iov_base, iov[i].iov_len);
    bufferp += iov[i].iov_len;
  }

  ret = amqp_tcp_socket_send_inner(self, self->buffer, bytes, 0);

exit:
  return ret;
#endif
}